

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O0

void __thiscall
HdlcAnalyzerResults::GenControlFieldString
          (HdlcAnalyzerResults *this,Frame *frame,DisplayBase display_base,bool tabular)

{
  HdlcFrameType HVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  string local_338 [39];
  allocator local_311;
  string local_310 [32];
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  stringstream local_268 [8];
  stringstream ss;
  ostream local_258 [392];
  char *local_d0;
  char *frameTypeStr;
  string escStr;
  char local_a8 [8];
  char ctlNumStr [64];
  char byteStr [64];
  bool tabular_local;
  DisplayBase display_base_local;
  Frame *frame_local;
  HdlcAnalyzerResults *this_local;
  
  AnalyzerHelpers::GetNumberString
            (*(ulonglong *)(frame + 0x10),display_base,8,ctlNumStr + 0x38,0x40);
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x18),Decimal,8,local_a8,0x40);
  GenEscapedString_abi_cxx11_((HdlcAnalyzerResults *)&frameTypeStr,(Frame *)this);
  local_d0 = (char *)0x0;
  if (*(long *)(frame + 0x18) == 0) {
    HVar1 = HdlcAnalyzer::GetFrameType((U8)frame[0x10]);
    if (HVar1 == HDLC_I_FRAME) {
      local_d0 = " - I-Frame";
    }
    else if (HVar1 == HDLC_S_FRAME) {
      local_d0 = " - S-Frame";
    }
    else if (HVar1 == HDLC_U_FRAME) {
      local_d0 = " - U-Frame";
    }
  }
  else {
    local_d0 = "";
  }
  std::__cxx11::stringstream::stringstream(local_268);
  poVar2 = std::operator<<(local_258,"CTL");
  poVar2 = std::operator<<(poVar2,local_a8);
  std::operator<<(poVar2," [");
  if (tabular) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_310,"",&local_311);
    std::__cxx11::stringstream::str((string *)local_268);
    std::__cxx11::string::~string(local_310);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
    poVar2 = std::operator<<(local_258,"Control");
    poVar2 = std::operator<<(poVar2,local_a8);
    std::operator<<(poVar2," [");
    std::__cxx11::stringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar3 = local_d0;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddTabularText((char *)this,pcVar4,ctlNumStr + 0x38,"]",pcVar3,pcVar5);
    std::__cxx11::string::~string(local_338);
  }
  else {
    AnalyzerResults::AddResultString((char *)this,"C",local_a8,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"CTL",local_a8,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::stringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddResultString((char *)this,pcVar3,ctlNumStr + 0x38,"]",pcVar4,(char *)0x0);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::stringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar3 = local_d0;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddResultString((char *)this,pcVar4,ctlNumStr + 0x38,"]",pcVar3,pcVar5);
    std::__cxx11::string::~string(local_2a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,"",&local_2c9);
    std::__cxx11::stringstream::str((string *)local_268);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    poVar2 = std::operator<<(local_258,"Control");
    poVar2 = std::operator<<(poVar2,local_a8);
    std::operator<<(poVar2," [");
    std::__cxx11::stringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar3 = local_d0;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddResultString((char *)this,pcVar4,ctlNumStr + 0x38,"]",pcVar3,pcVar5);
    std::__cxx11::string::~string(local_2f0);
  }
  std::__cxx11::stringstream::~stringstream(local_268);
  std::__cxx11::string::~string((string *)&frameTypeStr);
  return;
}

Assistant:

void HdlcAnalyzerResults::GenControlFieldString( const Frame& frame, DisplayBase display_base, bool tabular )
{
    char byteStr[ 64 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, byteStr, 64 );

    char ctlNumStr[ 64 ];
    AnalyzerHelpers::GetNumberString( frame.mData2, Decimal, 8, ctlNumStr, 64 );

    string escStr = GenEscapedString( frame );

    char* frameTypeStr = 0;
    if( frame.mData2 != 0 )
    {
        frameTypeStr = "";
    }
    else
    {
        switch( HdlcAnalyzer::GetFrameType( frame.mData1 ) )
        {
        case HDLC_I_FRAME:
            frameTypeStr = " - I-Frame";
            break;
        case HDLC_S_FRAME:
            frameTypeStr = " - S-Frame";
            break;
        case HDLC_U_FRAME:
            frameTypeStr = " - U-Frame";
            break;
        }
    }

    stringstream ss;
    ss << "CTL" << ctlNumStr << " [";

    if( !tabular )
    {
        AddResultString( "C", ctlNumStr );
        AddResultString( "CTL", ctlNumStr );
        AddResultString( ss.str().c_str(), byteStr, "]", escStr.c_str() );
        AddResultString( ss.str().c_str(), byteStr, "]", frameTypeStr, escStr.c_str() );
        ss.str( "" );
        ss << "Control" << ctlNumStr << " [";

        AddResultString( ss.str().c_str(), byteStr, "]", frameTypeStr, escStr.c_str() );
    }
    else
    {
        ss.str( "" );
        ss << "Control" << ctlNumStr << " [";
        AddTabularText( ss.str().c_str(), byteStr, "]", frameTypeStr, escStr.c_str() );
    }
}